

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GhostBend.cpp
# Opt level: O0

void __thiscall OpenMD::GhostBend::calcForce(GhostBend *this,RealType *angle,bool doParticlePot)

{
  reference ppAVar1;
  byte in_DL;
  double *in_RSI;
  long in_RDI;
  Vector<double,_3U> *v2;
  Vector<double,_3U> *v1;
  Vector3d force3;
  Vector3d force1;
  RealType commonFactor2;
  RealType commonFactor1;
  RealType sinTheta;
  RealType dVdTheta;
  RealType theta;
  RealType cosTheta;
  RealType d23inv;
  RealType d23;
  Vector3d r23;
  RealType d21inv;
  RealType d21;
  Vector3d r21;
  Vector3d pos2;
  Vector3d pos1;
  DirectionalAtom *ghostAtom;
  Vector<double,_3U> *in_stack_fffffffffffffc98;
  Vector<double,_3U> *in_stack_fffffffffffffca0;
  StuntDouble *in_stack_fffffffffffffca8;
  StuntDouble *in_stack_fffffffffffffcb0;
  value_type this_00;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffcb8;
  SquareMatrix3<double> *this_01;
  Vector3<double> *in_stack_fffffffffffffd00;
  Vector3<double> *in_stack_fffffffffffffd08;
  Vector3d *in_stack_fffffffffffffd18;
  Snapshot *in_stack_fffffffffffffd20;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_90;
  double local_88;
  value_type local_20;
  byte local_11;
  double *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),1)
  ;
  local_20 = *ppAVar1;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),0);
  this_01 = (SquareMatrix3<double> *)&stack0xffffffffffffffc8;
  StuntDouble::getPos(in_stack_fffffffffffffca8);
  StuntDouble::getPos(in_stack_fffffffffffffca8);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 8));
  Snapshot::wrapVector(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  local_88 = Vector<double,_3U>::length((Vector<double,_3U> *)0x3010c2);
  local_90 = 1.0 / local_88;
  StuntDouble::getA(in_stack_fffffffffffffca8);
  SquareMatrix3<double>::transpose(this_01);
  RectMatrix<double,_3U,_3U>::getColumn
            (in_stack_fffffffffffffcb8,(uint)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x301157);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x301164);
  local_168 = Vector<double,_3U>::length((Vector<double,_3U> *)0x301171);
  local_170 = 1.0 / local_168;
  local_178 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffcb0,
                             (Vector<double,_3U> *)in_stack_fffffffffffffca8);
  local_178 = local_178 / (local_88 * local_168);
  if (local_178 <= 1.0) {
    if (local_178 < -1.0) {
      local_178 = -1.0;
    }
  }
  else {
    local_178 = 1.0;
  }
  local_180 = acos(local_178);
  (**(code **)(**(long **)(in_RDI + 0x70) + 0x10))
            (local_180,*(long **)(in_RDI + 0x70),in_RDI + 0x68,&local_188);
  local_190 = sqrt(-local_178 * local_178 + 1.0);
  if (ABS(local_190) < 1e-06) {
    local_190 = 1e-06;
  }
  v2 = (Vector<double,_3U> *)((local_188 / local_190) * local_90);
  v1 = (Vector<double,_3U> *)((local_188 / local_190) * local_170);
  OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffca8,(double)v2);
  OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffca8,(double)v2);
  OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffca8,(double)v2);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffca8,v2);
  OpenMD::operator*((double)in_stack_fffffffffffffca8,v2);
  Vector3<double>::Vector3((Vector3<double> *)v2,in_stack_fffffffffffffc98);
  OpenMD::operator*(v1,(double)v2);
  OpenMD::operator*(v1,(double)v2);
  OpenMD::operator*(v1,(double)v2);
  OpenMD::operator-(v1,v2);
  OpenMD::operator*((double)v1,v2);
  Vector3<double>::Vector3((Vector3<double> *)v2,in_stack_fffffffffffffc98);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),0);
  StuntDouble::addFrc(in_stack_fffffffffffffcb0,(Vector3d *)v1);
  this_00 = local_20;
  OpenMD::operator-(v1);
  Vector3<double>::Vector3((Vector3<double> *)v2,in_stack_fffffffffffffc98);
  StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)v1);
  cross<double>(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  StuntDouble::addTrq(&this_00->super_StuntDouble,(Vector3d *)v1);
  if ((local_11 & 1) != 0) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),0);
    StuntDouble::addParticlePot(&this_00->super_StuntDouble,v1->data_);
    StuntDouble::addParticlePot(&this_00->super_StuntDouble,v1->data_);
  }
  *local_10 = (local_180 / 3.141592653589793) * 180.0;
  return;
}

Assistant:

void GhostBend::calcForce(RealType& angle, bool doParticlePot) {
    DirectionalAtom* ghostAtom = static_cast<DirectionalAtom*>(atoms_[1]);

    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = ghostAtom->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    RealType d21 = r21.length();

    RealType d21inv = 1.0 / d21;

    // we need the transpose of A to get the lab fixed vector:
    Vector3d r23 = ghostAtom->getA().transpose().getColumn(2);
    RealType d23 = r23.length();

    RealType d23inv = 1.0 / d23;

    RealType cosTheta = dot(r21, r23) / (d21 * d23);

    // check roundoff
    if (cosTheta > 1.0) {
      cosTheta = 1.0;
    } else if (cosTheta < -1.0) {
      cosTheta = -1.0;
    }

    RealType theta = acos(cosTheta);

    RealType dVdTheta;

    bendType_->calcForce(theta, potential_, dVdTheta);

    RealType sinTheta = sqrt(1.0 - cosTheta * cosTheta);

    if (fabs(sinTheta) < 1.0E-6) { sinTheta = 1.0E-6; }

    RealType commonFactor1 = dVdTheta / sinTheta * d21inv;
    RealType commonFactor2 = dVdTheta / sinTheta * d23inv;

    Vector3d force1 = commonFactor1 * (r23 * d23inv - r21 * d21inv * cosTheta);
    Vector3d force3 = commonFactor2 * (r21 * d21inv - r23 * d23inv * cosTheta);

    // Total force in current bend is zero

    atoms_[0]->addFrc(force1);
    ghostAtom->addFrc(-force1);

    ghostAtom->addTrq(cross(r23, force3));
    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      ghostAtom->addParticlePot(potential_);
    }

    angle = theta / Constants::PI * 180.0;
  }